

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxPrinter.cpp
# Opt level: O2

SyntaxPrinter * __thiscall slang::syntax::SyntaxPrinter::print(SyntaxPrinter *this,Trivia trivia)

{
  Token *pTVar1;
  SyntaxNode *pSVar2;
  Trivia *pTVar3;
  Trivia *t;
  long lVar4;
  string_view text;
  span<const_slang::parsing::Token,_18446744073709551615UL> sVar5;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar6;
  anon_union_12_4_39e54f29_for_Trivia_0 local_38;
  Token local_28;
  
  register0x00000010 = trivia._8_8_;
  local_38.rawText.ptr = (char *)trivia.field_0._0_8_;
  switch(trivia._12_4_ >> 8 & 0xff) {
  case 3:
  case 4:
    if (this->includeComments != true) {
      return this;
    }
  default:
    text = parsing::Trivia::getRawText((Trivia *)&local_38);
    append(this,text);
    return this;
  case 6:
    if (this->includeSkipped == true) {
      sVar5 = parsing::Trivia::getSkippedTokens((Trivia *)&local_38);
      pTVar1 = sVar5.data_;
      for (lVar4 = sVar5.size_ << 4; lVar4 != 0; lVar4 = lVar4 + -0x10) {
        print(this,*pTVar1);
        pTVar1 = pTVar1 + 1;
      }
      return this;
    }
    return this;
  case 7:
    if (this->includeSkipped != true) {
      return this;
    }
    break;
  case 8:
    if (this->includeDirectives != true) {
      if (this->includePreprocessed == true) {
        pSVar2 = parsing::Trivia::syntax((Trivia *)&local_38);
        local_28 = SyntaxNode::getFirstToken(pSVar2);
        sVar6 = parsing::Token::trivia(&local_28);
        pTVar3 = sVar6.data_;
        for (lVar4 = sVar6.size_ << 4; lVar4 != 0; lVar4 = lVar4 + -0x10) {
          print(this,*pTVar3);
          pTVar3 = pTVar3 + 1;
        }
        return this;
      }
      return this;
    }
  }
  pSVar2 = parsing::Trivia::syntax((Trivia *)&local_38);
  print(this,pSVar2);
  return this;
}

Assistant:

SyntaxPrinter& SyntaxPrinter::print(Trivia trivia) {
    switch (trivia.kind) {
        case TriviaKind::Directive:
            if (includeDirectives)
                print(*trivia.syntax());
            else if (includePreprocessed) {
                for (const auto& t : trivia.syntax()->getFirstToken().trivia())
                    print(t);
            }
            break;
        case TriviaKind::SkippedSyntax:
            if (includeSkipped)
                print(*trivia.syntax());
            break;
        case TriviaKind::SkippedTokens:
            if (includeSkipped) {
                for (Token t : trivia.getSkippedTokens())
                    print(t);
            }
            break;
        case TriviaKind::LineComment:
        case TriviaKind::BlockComment:
            if (!includeComments)
                break;
            [[fallthrough]];
        default:
            append(trivia.getRawText());
            break;
    }
    return *this;
}